

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264.c
# Opt level: O0

int h264_prep_sgmap(h264_slice *slice)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  void *pvVar8;
  int iVar9;
  long in_RDI;
  int muv;
  int ydir;
  int xdir;
  int ymax;
  int ymin;
  int xmax;
  int xmin;
  int y_1;
  int x_1;
  int cdf;
  int ybr;
  int xbr;
  int ytl;
  int xtl;
  int y;
  int x;
  int sulg;
  int musg0;
  int num;
  int k;
  int j;
  int i;
  int height;
  int width;
  int local_6c;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  int local_50;
  int local_30;
  int local_2c;
  int local_24;
  int local_20;
  int local_1c;
  
  if (*(long *)(in_RDI + 0xc38) == 0) {
    iVar1 = *(int *)(*(long *)(in_RDI + 0x30) + 0xc28);
    iVar4 = iVar1 + 1;
    iVar2 = *(int *)(*(long *)(in_RDI + 0x30) + 0xc2c);
    iVar5 = iVar2 + 1;
    iVar3 = *(int *)(*(long *)(in_RDI + 0x38) + 0x10);
    iVar6 = iVar3 + 1;
    pvVar8 = calloc(4,(long)(iVar4 * iVar5));
    *(void **)(in_RDI + 0xc38) = pvVar8;
    local_20 = 0;
    local_24 = 0;
    local_2c = *(int *)(in_RDI + 0xc04) * (*(int *)(*(long *)(in_RDI + 0x38) + 0x7c) + 1);
    if (iVar4 * iVar5 < local_2c) {
      local_2c = iVar4 * iVar5;
    }
    local_30 = local_2c;
    if (*(int *)(*(long *)(in_RDI + 0x38) + 0x78) != 0) {
      local_30 = iVar4 * iVar5 - local_2c;
    }
    for (local_1c = 0; local_1c < iVar4 * iVar5; local_1c = local_1c + 1) {
      iVar9 = local_1c % iVar4;
      iVar7 = local_1c / iVar4;
      switch(*(undefined4 *)(*(long *)(in_RDI + 0x38) + 0x14)) {
      case 0:
        *(int *)(*(long *)(in_RDI + 0xc38) + (long)local_1c * 4) = local_20;
        if (local_24 == *(int *)(*(long *)(in_RDI + 0x38) + 0x18 + (long)local_20 * 4)) {
          local_24 = 0;
          local_20 = (local_20 + 1) % iVar6;
        }
        else {
          local_24 = local_24 + 1;
        }
        break;
      case 1:
        *(int *)(*(long *)(in_RDI + 0xc38) + (long)local_1c * 4) =
             (iVar9 + (iVar7 * iVar6) / 2) % iVar6;
        break;
      case 2:
        *(int *)(*(long *)(in_RDI + 0xc38) + (long)local_1c * 4) = iVar3;
        local_20 = iVar3;
        while (local_20 = local_20 + -1, -1 < local_20) {
          if (((((int)(*(uint *)(*(long *)(in_RDI + 0x38) + 0x38 + (long)local_20 * 4) %
                      *(uint *)(in_RDI + 0xc18)) <= iVar9) &&
               (iVar9 <= (int)(*(uint *)(*(long *)(in_RDI + 0x38) + 0x58 + (long)local_20 * 4) %
                              *(uint *)(in_RDI + 0xc18)))) &&
              ((int)(*(uint *)(*(long *)(in_RDI + 0x38) + 0x38 + (long)local_20 * 4) /
                    *(uint *)(in_RDI + 0xc18)) <= iVar7)) &&
             (iVar7 <= (int)(*(uint *)(*(long *)(in_RDI + 0x38) + 0x58 + (long)local_20 * 4) /
                            *(uint *)(in_RDI + 0xc18)))) {
            *(int *)(*(long *)(in_RDI + 0xc38) + (long)local_1c * 4) = local_20;
          }
        }
        break;
      case 3:
        *(undefined4 *)(*(long *)(in_RDI + 0xc38) + (long)local_1c * 4) = 1;
        break;
      case 4:
        *(uint *)(*(long *)(in_RDI + 0xc38) + (long)local_1c * 4) =
             *(uint *)(*(long *)(in_RDI + 0x38) + 0x78) ^ (uint)(local_30 <= local_1c);
        break;
      case 5:
        local_24 = iVar9 * iVar5 + iVar7;
        *(uint *)(*(long *)(in_RDI + 0xc38) + (long)local_1c * 4) =
             *(uint *)(*(long *)(in_RDI + 0x38) + 0x78) ^ (uint)(local_30 <= local_24);
        break;
      case 6:
        if (iVar4 * iVar5 != *(int *)(*(long *)(in_RDI + 0x38) + 0x80) + 1) {
          fprintf(_stderr,"pic_size_in_map_units_minus1 mismatch!\n",
                  (long)local_1c % (long)iVar4 & 0xffffffff);
          return 1;
        }
        *(undefined4 *)(*(long *)(in_RDI + 0xc38) + (long)local_1c * 4) =
             *(undefined4 *)(*(long *)(*(long *)(in_RDI + 0x38) + 0x88) + (long)local_1c * 4);
        break;
      default:
        abort();
      }
    }
    if (*(int *)(*(long *)(in_RDI + 0x38) + 0x14) == 3) {
      iVar3 = *(int *)(*(long *)(in_RDI + 0x38) + 0x78);
      local_5c = (iVar4 - iVar3) / 2;
      local_64 = (iVar5 - iVar3) / 2;
      local_68 = iVar3 + -1;
      local_6c = iVar3;
      local_60 = local_64;
      local_58 = local_5c;
      local_54 = local_64;
      local_50 = local_5c;
      for (local_24 = 0; local_24 < local_2c; local_24 = iVar5 + local_24) {
        iVar5 = *(int *)(*(long *)(in_RDI + 0xc38) + (long)(local_54 * iVar4 + local_50) * 4);
        *(undefined4 *)(*(long *)(in_RDI + 0xc38) + (long)(local_54 * iVar4 + local_50) * 4) = 0;
        if ((local_68 == -1) && (local_50 == local_58)) {
          if (local_58 != 0) {
            local_58 = local_58 + -1;
          }
          local_50 = local_58;
          local_68 = 0;
          local_6c = iVar3 * 2 + -1;
        }
        else if ((local_68 == 1) && (local_50 == local_5c)) {
          if (local_5c != iVar1) {
            local_5c = local_5c + 1;
          }
          local_50 = local_5c;
          local_68 = 0;
          local_6c = iVar3 * -2 + 1;
        }
        else if ((local_6c == -1) && (local_54 == local_60)) {
          if (local_60 != 0) {
            local_60 = local_60 + -1;
          }
          local_54 = local_60;
          local_68 = iVar3 * -2 + 1;
          local_6c = 0;
        }
        else if ((local_6c == 1) && (local_54 == local_64)) {
          if (local_64 != iVar2) {
            local_64 = local_64 + 1;
          }
          local_54 = local_64;
          local_68 = iVar3 * 2 + -1;
          local_6c = 0;
        }
        else {
          local_50 = local_68 + local_50;
          local_54 = local_6c + local_54;
        }
      }
    }
  }
  return 0;
}

Assistant:

int h264_prep_sgmap(struct h264_slice *slice) {
	if (slice->sgmap)
		return 0;
	int width = slice->seqparm->pic_width_in_mbs_minus1 + 1;
	int height = slice->seqparm->pic_height_in_map_units_minus1 + 1;
	int i, j, k;
	int num = slice->picparm->num_slice_groups_minus1 + 1;
	slice->sgmap = calloc(sizeof *slice->sgmap, width * height);
	j = 0, k = 0;
	int musg0 = slice->slice_group_change_cycle * (slice->picparm->slice_group_change_rate_minus1 + 1);
	if (musg0 > width * height)
		musg0 = width * height;
	int sulg = musg0;
	if (slice->picparm->slice_group_change_direction_flag)
		sulg = width * height - sulg;
	for (i = 0; i < width * height; i++) {
		int x = i % width;
		int y = i / width;
		switch (slice->picparm->slice_group_map_type) {
			case H264_SLICE_GROUP_MAP_INTERLEAVED:
				slice->sgmap[i] = j;
				if (k == slice->picparm->run_length_minus1[j]) {
					k = 0;
					j++;
					j %= num;
				} else {
					k++;
				}
				break;
			case H264_SLICE_GROUP_MAP_DISPERSED:
				slice->sgmap[i] = (x + ((y * num) / 2)) % num;
				break;
			case H264_SLICE_GROUP_MAP_FOREGROUND:
				slice->sgmap[i] = num-1;
				for (j = num - 2; j >= 0; j--) {
					int xtl = slice->picparm->top_left[j] % slice->pic_width_in_mbs;
					int ytl = slice->picparm->top_left[j] / slice->pic_width_in_mbs;
					int xbr = slice->picparm->bottom_right[j] % slice->pic_width_in_mbs;
					int ybr = slice->picparm->bottom_right[j] / slice->pic_width_in_mbs;
					if (x >= xtl && x <= xbr && y >= ytl && y <= ybr)
						slice->sgmap[i] = j;
				}
				break;
			case H264_SLICE_GROUP_MAP_CHANGING_BOX:
				slice->sgmap[i] = 1;
				/* will be fixed below */
				break;
			case H264_SLICE_GROUP_MAP_CHANGING_VERTICAL:
				slice->sgmap[i] = slice->picparm->slice_group_change_direction_flag ^ (i >= sulg);
				break;
			case H264_SLICE_GROUP_MAP_CHANGING_HORIZONTAL:
				k = x * height + y;
				slice->sgmap[i] = slice->picparm->slice_group_change_direction_flag ^ (k >= sulg);
				break;
			case H264_SLICE_GROUP_MAP_EXPLICIT:
				if (width * height != slice->picparm->pic_size_in_map_units_minus1 + 1) {
					fprintf(stderr, "pic_size_in_map_units_minus1 mismatch!\n");
					return 1;
				}
				slice->sgmap[i] = slice->picparm->slice_group_id[i];
				break;
			default:
				abort();
		}
	}
	if (slice->picparm->slice_group_map_type == H264_SLICE_GROUP_MAP_CHANGING_BOX) {
		int cdf = slice->picparm->slice_group_change_direction_flag;
		int x = (width - cdf) / 2;
		int y = (height - cdf) / 2;
		int xmin = x, xmax = x;
		int ymin = y, ymax = y;
		int xdir = cdf - 1;
		int ydir = cdf;
		int muv;
		for (k = 0; k < musg0; k += muv) {
			muv = slice->sgmap[y * width + x];
			slice->sgmap[y * width + x] = 0;
			if (xdir == -1 && x == xmin) {
				if (xmin)
					xmin--;
				x = xmin;
				xdir = 0;
				ydir = 2 * cdf - 1;
			} else if (xdir == 1 && x == xmax) {
				if (xmax != width - 1)
					xmax++;
				x = xmax;
				xdir = 0;
				ydir = 1 - 2 * cdf;
			} else if (ydir == -1 && y == ymin) {
				if (ymin)
					ymin--;
				y = ymin;
				xdir = 1 - 2 * cdf;
				ydir = 0;
			} else if (ydir == 1 && y == ymax) {
				if (ymax != height - 1)
					ymax++;
				y = ymax;
				xdir = 2 * cdf - 1;
				ydir = 0;
			} else {
				x += xdir;
				y += ydir;
			}
		}
	}
	return 0;
}